

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

float Abc_NtkDelayTrace(Abc_Ntk_t *pNtk,Abc_Obj_t *pOut,Abc_Obj_t *pIn,int fPrint)

{
  long *plVar1;
  float *pfVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *vSlacks;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  Vec_Int_t *vBest;
  void *pvVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  Abc_Obj_t *pFanin;
  char *pcVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_60;
  
  if ((pNtk->ntkFunc != ABC_FUNC_MAP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsMappedLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,0x3e6,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if ((pOut != (Abc_Obj_t *)0x0) && ((*(uint *)&pOut->field_0x14 & 0xf) - 5 < 0xfffffffe)) {
    __assert_fail("pOut == NULL || Abc_ObjIsCo(pOut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,999,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if (((pIn != (Abc_Obj_t *)0x0) && (uVar3 = *(uint *)&pIn->field_0x14 & 0xf, uVar3 != 2)) &&
     (uVar3 != 5)) {
    __assert_fail("pIn == NULL || Abc_ObjIsCi(pIn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,1000,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  iVar12 = 0;
  if ((pOut == (Abc_Obj_t *)0x0 && pIn == (Abc_Obj_t *)0x0) && fPrint == 0) {
    vSlacks = (Vec_Int_t *)0x0;
  }
  else {
    vSlacks = Abc_NtkDelayTraceSlackStart(pNtk);
  }
  Abc_NtkTimePrepare(pNtk);
  pVVar5 = Abc_NtkDfs(pNtk,1);
  for (; iVar12 < pVVar5->nSize; iVar12 = iVar12 + 1) {
    pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pVVar5,iVar12);
    Abc_NodeDelayTraceArrival(pAVar6,vSlacks);
  }
  Vec_PtrFree(pVVar5);
  local_60 = -1e+09;
  for (iVar12 = 0; iVar13 = pNtk->vCos->nSize, iVar12 < iVar13; iVar12 = iVar12 + 1) {
    pAVar6 = Abc_NtkCo(pNtk,iVar12);
    plVar1 = (long *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
    pfVar2 = *(float **)
              (*(long *)(*(long *)(*(long *)(*plVar1 + 0x108) + 0x10) + 8) +
              (long)(int)plVar1[2] * 8);
    fVar17 = pfVar2[1];
    fVar16 = *pfVar2;
    if (fVar17 <= fVar16) {
      fVar17 = fVar16;
    }
    if (fVar17 <= local_60) {
      fVar17 = local_60;
    }
    local_60 = fVar17;
  }
  if (pOut == (Abc_Obj_t *)0x0 && fPrint != 0) {
    pOut = (Abc_Obj_t *)0x0;
    for (iVar12 = 0; iVar12 < iVar13; iVar12 = iVar12 + 1) {
      pAVar6 = Abc_NtkCo(pNtk,iVar12);
      plVar1 = (long *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
      pfVar2 = *(float **)
                (*(long *)(*(long *)(*(long *)(*plVar1 + 0x108) + 0x10) + 8) +
                (long)(int)plVar1[2] * 8);
      fVar16 = pfVar2[1];
      fVar17 = *pfVar2;
      if (fVar16 <= fVar17) {
        fVar16 = fVar17;
      }
      if (local_60 != fVar16) {
        pAVar6 = pOut;
      }
      if (!NAN(local_60) && !NAN(fVar16)) {
        pOut = pAVar6;
      }
      iVar13 = pNtk->vCos->nSize;
    }
    if (pOut == (Abc_Obj_t *)0x0) {
      __assert_fail("pOut != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x409,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
    }
  }
  if (fPrint != 0) {
    pVVar5 = Vec_PtrAlloc(100);
    iVar12 = pNtk->vObjs->nSize;
    vBest = Vec_IntAlloc(iVar12);
    vBest->nSize = iVar12;
    if (vBest->pArray != (int *)0x0) {
      memset(vBest->pArray,0xff,(long)iVar12 << 2);
    }
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      Vec_IntFill(&pNtk->vTravIds,pNtk->vObjs->nSize + 500,0);
    }
    iVar12 = pNtk->nTravIds;
    pNtk->nTravIds = iVar12 + 1;
    if (0x3ffffffe < iVar12) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    iVar12 = Abc_NtkDelayTraceCritPath_rec
                       (vSlacks,(Abc_Obj_t *)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray],pIn,
                        vBest);
    if (iVar12 == 0) {
      if (pIn == (Abc_Obj_t *)0x0) {
        pcVar8 = Abc_ObjName(pOut);
        printf("The logic cone of PO \"%s\" has no primary inputs.\n",pcVar8);
      }
      else {
        pcVar8 = Abc_ObjName(pIn);
        pcVar10 = Abc_ObjName(pOut);
        printf("There is no combinational path between PI \"%s\" and PO \"%s\".\n",pcVar8,pcVar10);
      }
    }
    else {
      fVar16 = Abc_NodeReadRequiredWorst(pOut);
      pAVar6 = (Abc_Obj_t *)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray];
      fVar17 = Abc_NodeReadArrivalWorst(pAVar6);
      Abc_NtkDelayTraceCritPathCollect_rec(vSlacks,pAVar6,vBest,pVVar5);
      if (pIn == (Abc_Obj_t *)0x0) {
        pIn = (Abc_Obj_t *)Vec_PtrEntry(pVVar5,0);
      }
      iVar12 = pVVar5->nSize;
      iVar13 = 0;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      iVar14 = 0;
      for (; iVar12 != iVar13; iVar13 = iVar13 + 1) {
        pvVar7 = Vec_PtrEntry(pVVar5,iVar13);
        iVar4 = iVar14;
        if ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7) {
          pcVar8 = Mio_GateReadName(*(Mio_Gate_t **)((long)pvVar7 + 0x38));
          sVar9 = strlen(pcVar8);
          iVar4 = (int)sVar9;
          if ((int)sVar9 < iVar14) {
            iVar4 = iVar14;
          }
        }
        iVar14 = iVar4;
      }
      Abc_NtkLevel(pNtk);
      pcVar8 = Abc_ObjName(pIn);
      pcVar10 = Abc_ObjName(pOut);
      printf("Critical path from PI \"%s\" to PO \"%s\":\n",pcVar8,pcVar10);
      iVar12 = pVVar5->nSize;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      for (iVar13 = 0; iVar13 != iVar12; iVar13 = iVar13 + 1) {
        pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pVVar5,iVar13);
        printf("Level %3d : ",(ulong)(*(uint *)&pAVar6->field_0x14 >> 0xc));
        uVar3 = *(uint *)&pAVar6->field_0x14 & 0xf;
        pcVar8 = "Primary input \"%s\".   ";
        pcVar10 = "Arrival time =%6.1f. ";
        if (uVar3 == 2) {
LAB_002c987b:
          pcVar11 = Abc_ObjName(pAVar6);
          printf(pcVar8,pcVar11);
        }
        else {
          pcVar8 = "Primary input \"%s\".   ";
          pcVar10 = "Arrival time =%6.1f. ";
          if (uVar3 == 5) goto LAB_002c987b;
          pcVar8 = "Primary output \"%s\".   ";
          pcVar10 = "Arrival =%6.1f. ";
          if (0xfffffffd < uVar3 - 5) goto LAB_002c987b;
          if (uVar3 != 7) {
            __assert_fail("Abc_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                          ,0x43c,
                          "float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
          }
          pFanin = (Abc_Obj_t *)Vec_PtrEntry(pVVar5,iVar13 + -1);
          iVar4 = Abc_NodeFindFanin(pAVar6,pFanin);
          Abc_NtkDelayTraceSlack(vSlacks,pAVar6,iVar4);
          pcVar8 = Abc_ObjName(pAVar6);
          printf("%10s/",pcVar8);
          pcVar8 = Mio_GateReadPinName((Mio_Gate_t *)(pAVar6->field_5).pData,iVar4);
          printf("%-4s",pcVar8);
          pcVar8 = Mio_GateReadName((Mio_Gate_t *)(pAVar6->field_5).pData);
          printf(" (%s)",pcVar8);
          pcVar8 = Mio_GateReadName((Mio_Gate_t *)(pAVar6->field_5).pData);
          for (sVar9 = strlen(pcVar8); (int)sVar9 < iVar14; sVar9 = (size_t)((int)sVar9 + 1)) {
            putchar(0x20);
          }
          printf("   ");
          fVar18 = Abc_NodeReadArrivalWorst(pAVar6);
          printf("Arrival =%6.1f.   ",(double)fVar18);
          printf("I/O times: (");
          for (lVar15 = 0; lVar15 < (pAVar6->vFanins).nSize; lVar15 = lVar15 + 1) {
            pcVar8 = "    \"%s\", ";
            if (lVar15 == 0) {
              pcVar8 = "T = %d\t\t";
            }
            fVar18 = Abc_NodeReadArrivalWorst
                               ((Abc_Obj_t *)
                                pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar15]]);
            printf("%s%.1f",(double)fVar18,pcVar8 + 8);
          }
          pcVar10 = " -> %.1f)";
        }
        fVar18 = Abc_NodeReadArrivalWorst(pAVar6);
        printf(pcVar10,(double)fVar18);
        putchar(10);
      }
      printf("Level %3d : ",
             (ulong)((*(uint *)((long)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray] + 0x14) >>
                     0xc) + 1));
      pcVar8 = Abc_ObjName(pOut);
      printf("Primary output \"%s\".   ",pcVar8);
      fVar18 = Abc_NodeReadRequiredWorst(pOut);
      printf("Required time = %6.1f.  ",(double)fVar18);
      printf("Path slack = %6.1f.\n",(double)(fVar16 - fVar17));
    }
    Vec_PtrFree(pVVar5);
    Vec_IntFree(vBest);
  }
  if (vSlacks != (Vec_Int_t *)0x0) {
    free(vSlacks->pArray);
    free(vSlacks);
  }
  return local_60;
}

Assistant:

float Abc_NtkDelayTrace( Abc_Ntk_t * pNtk, Abc_Obj_t * pOut, Abc_Obj_t * pIn, int fPrint )
{
    Vec_Int_t * vSlacks = NULL;
    Abc_Obj_t * pNode, * pDriver;
    Vec_Ptr_t * vNodes;
    Abc_Time_t * pTime;
    float tArrivalMax;
    int i;

    assert( Abc_NtkIsMappedLogic(pNtk) );
    assert( pOut == NULL || Abc_ObjIsCo(pOut) );
    assert( pIn == NULL || Abc_ObjIsCi(pIn) );

    // create slacks (need slacks if printing is requested even if pIn/pOut are not given)
    if ( pOut || pIn || fPrint )
        vSlacks = Abc_NtkDelayTraceSlackStart( pNtk );

    // compute the timing
    Abc_NtkTimePrepare( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Abc_NodeDelayTraceArrival( pNode, vSlacks );
    Vec_PtrFree( vNodes );

    // get the latest arrival times
    tArrivalMax = -ABC_INFINITY;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0(pNode);
        pTime   = Abc_NodeArrival(pDriver);
        if ( tArrivalMax < Abc_MaxFloat(pTime->Fall, pTime->Rise) )
            tArrivalMax = Abc_MaxFloat(pTime->Fall, pTime->Rise);
    }

    // determine the output to print
    if ( fPrint && pOut == NULL )
    {
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            pDriver = Abc_ObjFanin0(pNode);
            pTime   = Abc_NodeArrival(pDriver);
            if ( tArrivalMax == Abc_MaxFloat(pTime->Fall, pTime->Rise) )
                pOut = pNode;
        }
        assert( pOut != NULL );
    }

    if ( fPrint )
    {
        Vec_Ptr_t * vPath = Vec_PtrAlloc( 100 );
        Vec_Int_t * vBest = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
        // traverse to determine the critical path
        Abc_NtkIncrementTravId( pNtk );
        if ( !Abc_NtkDelayTraceCritPath_rec( vSlacks, Abc_ObjFanin0(pOut), pIn, vBest ) )
        {
            if ( pIn == NULL )
                printf( "The logic cone of PO \"%s\" has no primary inputs.\n", Abc_ObjName(pOut) );
            else
                printf( "There is no combinational path between PI \"%s\" and PO \"%s\".\n", Abc_ObjName(pIn), Abc_ObjName(pOut) );
        }
        else
        {
            float Slack = 0.0, SlackAdd;
            int k, iFanin, Length = 0;
            Abc_Obj_t * pFanin;
            // check the additional slack
            SlackAdd = Abc_NodeReadRequiredWorst(pOut) - Abc_NodeReadArrivalWorst(Abc_ObjFanin0(pOut));
            // collect the critical path
            Abc_NtkDelayTraceCritPathCollect_rec( vSlacks, Abc_ObjFanin0(pOut), vBest, vPath );
            if ( pIn == NULL )
                pIn = (Abc_Obj_t *)Vec_PtrEntry( vPath, 0 );
            // find the longest gate name
            Vec_PtrForEachEntry( Abc_Obj_t *, vPath, pNode, i )
                if ( Abc_ObjIsNode(pNode) )
                    Length = Abc_MaxInt( Length, strlen(Mio_GateReadName((Mio_Gate_t *)pNode->pData)) );
            // print critical path
            Abc_NtkLevel( pNtk );
            printf( "Critical path from PI \"%s\" to PO \"%s\":\n", Abc_ObjName(pIn), Abc_ObjName(pOut) ); 
            Vec_PtrForEachEntry( Abc_Obj_t *, vPath, pNode, i )
            {
                printf( "Level %3d : ", Abc_ObjLevel(pNode) );
                if ( Abc_ObjIsCi(pNode) )
                {
                    printf( "Primary input \"%s\".   ", Abc_ObjName(pNode) );
                    printf( "Arrival time =%6.1f. ", Abc_NodeReadArrivalWorst(pNode) );
                    printf( "\n" );
                    continue;
                }
                if ( Abc_ObjIsCo(pNode) )
                {
                    printf( "Primary output \"%s\".   ", Abc_ObjName(pNode) );
                    printf( "Arrival =%6.1f. ", Abc_NodeReadArrivalWorst(pNode) );
                }
                else
                {
                    assert( Abc_ObjIsNode(pNode) );
                    iFanin = Abc_NodeFindFanin( pNode, (Abc_Obj_t *)Vec_PtrEntry(vPath,i-1) );
                    Slack = Abc_NtkDelayTraceSlack(vSlacks, pNode, iFanin);
                    printf( "%10s/", Abc_ObjName(pNode) );
                    printf( "%-4s", Mio_GateReadPinName((Mio_Gate_t *)pNode->pData, iFanin) );
                    printf( " (%s)", Mio_GateReadName((Mio_Gate_t *)pNode->pData) );
                    for ( k = strlen(Mio_GateReadName((Mio_Gate_t *)pNode->pData)); k < Length; k++ )
                        printf( " " );
                    printf( "   " );
                    printf( "Arrival =%6.1f.   ", Abc_NodeReadArrivalWorst(pNode) );
                    printf( "I/O times: (" );
                    Abc_ObjForEachFanin( pNode, pFanin, k )
                        printf( "%s%.1f", (k? ", ":""), Abc_NodeReadArrivalWorst(pFanin) );
//                    printf( " -> %.1f)", Abc_NodeReadArrival(pNode)->Worst + Slack + SlackAdd );
                    printf( " -> %.1f)", Abc_NodeReadArrivalWorst(pNode) );
                }
                printf( "\n" );
            }
            printf( "Level %3d : ", Abc_ObjLevel(Abc_ObjFanin0(pOut)) + 1 );
            printf( "Primary output \"%s\".   ", Abc_ObjName(pOut) );
            printf( "Required time = %6.1f.  ", Abc_NodeReadRequiredWorst(pOut) );
            printf( "Path slack = %6.1f.\n", SlackAdd );
        }
        Vec_PtrFree( vPath );
        Vec_IntFree( vBest );
    }

    Vec_IntFreeP( &vSlacks );
    return tArrivalMax;
}